

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall efsw::String::replace(String *this,Iterator i1,Iterator i2,String *str)

{
  __const_iterator local_38;
  __const_iterator local_30;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_28;
  String *str_local;
  String *this_local;
  Iterator i2_local;
  Iterator i1_local;
  
  local_28 = &str->mString;
  str_local = this;
  this_local = (String *)i2._M_current;
  i2_local = i1;
  __gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>::
  __normal_iterator<char32_t*>
            ((__normal_iterator<char32_t_const*,std::__cxx11::u32string> *)&local_30,&i2_local);
  __gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>::
  __normal_iterator<char32_t*>
            ((__normal_iterator<char32_t_const*,std::__cxx11::u32string> *)&local_38,
             (__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              *)&this_local);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(&this->mString,local_30,local_38,local_28);
  return this;
}

Assistant:

String& String::replace( Iterator i1, Iterator i2, const String& str ) {
	mString.replace( i1, i2, str.mString );

	return *this;
}